

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ground_plane.cpp
# Opt level: O0

double __thiscall ON_GroundPlane::CImpl::Altitude(CImpl *this)

{
  wchar_t *path_to_node;
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  CImpl *local_10;
  CImpl *this_local;
  
  local_10 = this;
  path_to_node = XMLPath();
  ::ON_XMLVariant::ON_XMLVariant(&local_200,0.0);
  ON_InternalXMLImpl::GetParameter
            (&local_108,&this->super_ON_InternalXMLImpl,path_to_node,L"altitude",&local_200);
  dVar1 = ::ON_XMLVariant::AsDouble(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  return dVar1;
}

Assistant:

double Altitude(void)            const { return GetParameter(XMLPath(), ON_RDK_GP_ALTITUDE, 0.0).AsDouble(); }